

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O0

SimpleString __thiscall JUnitTestOutput::encodeXmlText(JUnitTestOutput *this,SimpleString *textbody)

{
  size_t extraout_RDX;
  SimpleString *in_RDI;
  SimpleString SVar1;
  char *in_stack_00000010;
  char *in_stack_00000018;
  SimpleString *in_stack_00000020;
  SimpleString *buf;
  char *in_stack_ffffffffffffffb8;
  
  SimpleString::asCharString((SimpleString *)0x17c14f);
  SimpleString::SimpleString(in_RDI,in_stack_ffffffffffffffb8);
  SimpleString::replace(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  SimpleString::replace(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  SimpleString::replace(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  SimpleString::replace(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  SimpleString::replace(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  SVar1.bufferSize_ = extraout_RDX;
  SVar1.buffer_ = (char *)in_RDI;
  return SVar1;
}

Assistant:

SimpleString JUnitTestOutput::encodeXmlText(const SimpleString& textbody)
{
    SimpleString buf = textbody.asCharString();
    buf.replace("&", "&amp;");
    buf.replace("\"", "&quot;");
    buf.replace("<", "&lt;");
    buf.replace(">", "&gt;");
    buf.replace("\n", "{newline}");
    return buf;
}